

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2test.c
# Opt level: O3

int pchars8(PCRE2_SPTR8 p,int length,BOOL utf,FILE *f)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  uint uVar5;
  BOOL utf_00;
  int iVar6;
  int iVar7;
  uint32_t local_34 [2];
  uint32_t c;
  
  sVar4 = (size_t)(uint)length;
  local_34[0] = 0;
  if (length < 0) {
    sVar4 = strlen((char *)p);
  }
  iVar6 = 0;
  uVar5 = (uint)sVar4;
  do {
    if ((int)uVar5 < 1) {
      return iVar6;
    }
    iVar7 = (int)sVar4;
    if (utf == 0) {
      bVar1 = *p;
      utf_00 = 0;
LAB_0010adc7:
      local_34[0] = (uint32_t)bVar1;
      iVar3 = pchar((uint)bVar1,utf_00,f);
      uVar5 = iVar7 - 1;
      p = p + 1;
    }
    else {
      uVar2 = utf82ord(p,local_34);
      uVar5 = iVar7 - uVar2;
      if (iVar7 < (int)uVar2 || (int)uVar2 < 1) {
        bVar1 = *p;
        utf_00 = utf;
        goto LAB_0010adc7;
      }
      p = p + uVar2;
      iVar3 = pchar(local_34[0],utf,f);
    }
    iVar6 = iVar6 + iVar3;
    sVar4 = (size_t)uVar5;
  } while( true );
}

Assistant:

static int pchars8(PCRE2_SPTR8 p, int length, BOOL utf, FILE *f)
{
uint32_t c = 0;
int yield = 0;
if (length < 0) length = strlen((char *)p);
while (length-- > 0)
  {
  if (utf)
    {
    int rc = utf82ord(p, &c);
    if (rc > 0 && rc <= length + 1)   /* Mustn't run over the end */
      {
      length -= rc - 1;
      p += rc;
      yield += pchar(c, utf, f);
      continue;
      }
    }
  c = *p++;
  yield += pchar(c, utf, f);
  }
return yield;
}